

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShadingLanguage420PackTests.cpp
# Opt level: O3

GLchar * __thiscall
gl4cts::GLSL420Pack::LineContinuationTest::prepareSourceTexture
          (LineContinuationTest *this,texture *texture)

{
  pointer puVar1;
  long lVar2;
  long lVar3;
  pointer puVar4;
  vector<unsigned_int,_std::allocator<unsigned_int>_> data;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_28;
  
  local_28.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_28.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_28.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize(&local_28,0x1000);
  puVar4 = local_28.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start;
  memset(local_28.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
         super__Vector_impl_data._M_start,0xaa,0x4000);
  puVar4 = puVar4 + 0x410;
  lVar2 = 0x10;
  do {
    lVar3 = 0;
    do {
      puVar1 = puVar4 + lVar3;
      puVar1[0] = 0xffff0000;
      puVar1[1] = 0xffff0000;
      puVar1[2] = 0xffff0000;
      puVar1[3] = 0xffff0000;
      lVar3 = lVar3 + 4;
    } while (lVar3 != 0x20);
    lVar2 = lVar2 + 1;
    puVar4 = puVar4 + 0x40;
  } while (lVar2 != 0x30);
  Utils::texture::create(texture,0x40,0x40,0x8058);
  Utils::texture::update
            (texture,0x40,0x40,0,0x1908,0x1401,
             local_28.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_start);
  if (local_28.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_28.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                    .super__Vector_impl_data._M_start,
                    (long)local_28.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_28.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  return "uni_sampler";
}

Assistant:

const GLchar* LineContinuationTest::prepareSourceTexture(Utils::texture& texture)
{
	std::vector<GLuint> data;
	static const GLuint width	  = 64;
	static const GLuint height	 = 64;
	static const GLuint data_size  = width * height;
	static const GLuint blue_color = 0xffff0000;
	static const GLuint grey_color = 0xaaaaaaaa;

	data.resize(data_size);

	for (GLuint i = 0; i < data_size; ++i)
	{
		data[i] = grey_color;
	}

	for (GLuint y = 16; y < 48; ++y)
	{
		const GLuint line_offset = y * 64;

		for (GLuint x = 16; x < 48; ++x)
		{
			const GLuint pixel_offset = x + line_offset;

			data[pixel_offset] = blue_color;
		}
	}

	texture.create(width, height, GL_RGBA8);

	texture.update(width, height, 0 /* depth */, GL_RGBA, GL_UNSIGNED_BYTE, &data[0]);

	return "uni_sampler";
}